

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall
cmGlobalNinjaGenerator::WriteTargetCleanAdditional(cmGlobalNinjaGenerator *this,ostream *os)

{
  undefined1 *this_00;
  cmLocalGenerator *this_01;
  reference ppcVar1;
  string *psVar2;
  ostream *poVar3;
  _Rb_tree_node_base *p_Var4;
  bool bVar5;
  allocator<char> local_349;
  string local_348;
  cmLocalGenerator *local_328;
  ostream *local_320;
  string local_318;
  string cleanScriptAbs;
  string cleanScriptRel;
  string local_2b8;
  string local_298;
  cmGeneratedFileStream fout;
  
  local_320 = os;
  ppcVar1 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::at
                      (&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        LocalGenerators,0);
  this_01 = *ppcVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cleanScriptRel,"CMakeFiles/clean_additional.cmake",(allocator<char> *)&fout)
  ;
  local_328 = this_01;
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(this_01);
  std::__cxx11::string::string((string *)&cleanScriptAbs,(string *)psVar2);
  std::__cxx11::string::push_back((char)&cleanScriptAbs);
  std::__cxx11::string::append((string *)&cleanScriptAbs);
  if ((this->AdditionalCleanFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    cmsys::SystemTools::RemoveFile(&cleanScriptAbs);
  }
  else {
    cmGeneratedFileStream::cmGeneratedFileStream(&fout,&cleanScriptAbs,false,None);
    if (((&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
                _vptr_basic_ostream[-3]] & 5) == 0) {
      std::operator<<((ostream *)&fout,"# Additional clean files\n\n");
      std::operator<<((ostream *)&fout,"file(REMOVE_RECURSE\n");
      for (p_Var4 = (this->AdditionalCleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left;
          (_Rb_tree_header *)p_Var4 !=
          &(this->AdditionalCleanFiles)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        poVar3 = std::operator<<((ostream *)&fout,"  ");
        psVar2 = ConvertToNinjaPath(this,(string *)(p_Var4 + 1));
        cmOutputConverter::EscapeForCMake(&local_348,psVar2);
        poVar3 = std::operator<<(poVar3,(string *)&local_348);
        std::operator<<(poVar3,'\n');
        std::__cxx11::string::~string((string *)&local_348);
      }
      std::operator<<((ostream *)&fout,")\n");
      cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_328->Makefile->OutputFiles,&cleanScriptAbs);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_298,"CLEAN_ADDITIONAL",(allocator<char> *)&local_348);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)&fout,&local_298);
      std::__cxx11::string::~string((string *)&local_298);
      CMakeCmd_abi_cxx11_(&local_348,this);
      this_00 = &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::append(this_00);
      NinjaOutputPath(&local_318,this,&cleanScriptRel);
      cmOutputConverter::ConvertToOutputFormat
                (&local_348,&local_328->super_cmOutputConverter,&local_318,SHELL);
      std::__cxx11::string::append((string *)this_00);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::assign
                (&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x40)
      ;
      std::__cxx11::string::assign
                (&fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x60)
      ;
      WriteRule((ostream *)
                (this->RulesFileStream)._M_t.
                super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                (cmNinjaRule *)&fout);
      cmNinjaRule::~cmNinjaRule((cmNinjaRule *)&fout);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b8,"CLEAN_ADDITIONAL",(allocator<char> *)&local_348);
      cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)&fout,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      std::__cxx11::string::assign((char *)&fout);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,"CMakeFiles/clean.additional",&local_349);
      NinjaOutputPath(&local_348,this,&local_318);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &fout.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x40,
                 &local_348);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::string::~string((string *)&local_318);
      WriteBuild(this,local_320,(cmNinjaBuild *)&fout,0,(bool *)0x0);
      cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)&fout);
      bVar5 = true;
      goto LAB_002279aa;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream(&fout);
  }
  bVar5 = false;
LAB_002279aa:
  std::__cxx11::string::~string((string *)&cleanScriptAbs);
  std::__cxx11::string::~string((string *)&cleanScriptRel);
  return bVar5;
}

Assistant:

bool cmGlobalNinjaGenerator::WriteTargetCleanAdditional(std::ostream& os)
{
  cmLocalGenerator* lgr = this->LocalGenerators.at(0);
  std::string cleanScriptRel = "CMakeFiles/clean_additional.cmake";
  std::string cleanScriptAbs = lgr->GetBinaryDirectory();
  cleanScriptAbs += '/';
  cleanScriptAbs += cleanScriptRel;

  // Check if there are additional files to clean
  if (this->AdditionalCleanFiles.empty()) {
    // Remove cmake clean script file if it exists
    cmSystemTools::RemoveFile(cleanScriptAbs);
    return false;
  }

  // Write cmake clean script file
  {
    cmGeneratedFileStream fout(cleanScriptAbs);
    if (!fout) {
      return false;
    }
    fout << "# Additional clean files\n\n";
    fout << "file(REMOVE_RECURSE\n";
    for (std::string const& acf : this->AdditionalCleanFiles) {
      fout << "  "
           << cmOutputConverter::EscapeForCMake(ConvertToNinjaPath(acf))
           << '\n';
    }
    fout << ")\n";
  }
  // Register clean script file
  lgr->GetMakefile()->AddCMakeOutputFile(cleanScriptAbs);

  // Write rule
  {
    cmNinjaRule rule("CLEAN_ADDITIONAL");
    rule.Command = CMakeCmd();
    rule.Command += " -P ";
    rule.Command += lgr->ConvertToOutputFormat(
      this->NinjaOutputPath(cleanScriptRel), cmOutputConverter::SHELL);
    rule.Description = "Cleaning additional files...";
    rule.Comment = "Rule for cleaning additional files.";
    WriteRule(*this->RulesFileStream, rule);
  }

  // Write build
  {
    cmNinjaBuild build("CLEAN_ADDITIONAL");
    build.Comment = "Clean additional files.";
    build.Outputs.push_back(
      this->NinjaOutputPath(this->GetAdditionalCleanTargetName()));
    WriteBuild(os, build);
  }
  // Return success
  return true;
}